

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

String * Jinx::Impl::ConvertWStringToUtf8(String *__return_storage_ptr__,WString *wStr)

{
  String *outString;
  char32_t *pcVar1;
  char outBuffer [5];
  size_t numOut;
  
  pcVar1 = (wStr->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,wStr->_M_string_length);
  outBuffer[4] = '\0';
  outBuffer[0] = '\0';
  outBuffer[1] = '\0';
  outBuffer[2] = '\0';
  outBuffer[3] = '\0';
  numOut = 0;
  for (; *pcVar1 != L'\0'; pcVar1 = pcVar1 + 1) {
    ConvertUtf32ToUtf8(*pcVar1,outBuffer,5,&numOut);
    outBuffer[numOut] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__,outBuffer);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String ConvertWStringToUtf8(const WString & wStr)
	{
		// Compile-time check to determine size of wchar_t, and perform appropriate UTF-16 or UTF-32 conversion
		if constexpr (sizeof(wchar_t) == 4)
		{
			auto cInStr = reinterpret_cast<const char32_t *>(wStr.c_str());
			String outString;
			outString.reserve(wStr.size());
			char outBuffer[5] = { 0, 0, 0, 0, 0 };
			size_t numOut = 0;
			while (*cInStr != 0)
			{
				Impl::ConvertUtf32ToUtf8(*cInStr, outBuffer, std::size(outBuffer), &numOut);
				outBuffer[numOut] = 0;
				++cInStr;
				outString += outBuffer;
			}
			return outString;
		}
		else
		{
			return ConvertUtf16ToUtf8(reinterpret_cast<const char16_t *>(wStr.c_str()));
		}
	}